

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeSplit(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  Type *pTVar3;
  Type *pTVar4;
  mapped_type *pmVar5;
  long lVar6;
  void **ppvVar7;
  long in_stack_00000008;
  string input;
  int *in_stack_00000048;
  allocator local_49;
  string local_48;
  
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  if ((pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    std::__cxx11::string::string((string *)&local_48,"Must have 1 input",&local_49);
    errorInCaffeProto(&local_48,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_48);
  }
  lVar6 = 0;
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(pTVar3->bottom_).super_RepeatedPtrFieldBase,0);
  std::__cxx11::string::string((string *)&local_48,(string *)pTVar4);
  pRVar2 = (pTVar3->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  iVar1 = (pTVar3->top_).super_RepeatedPtrFieldBase.current_size_;
  for (; (long)iVar1 * 8 != lVar6; lVar6 = lVar6 + 8) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)input.field_2._8_8_,*(key_type **)((long)ppvVar7 + lVar6));
    std::__cxx11::string::_M_assign((string *)pmVar5);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeSplit(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    /*
     Split: Split layer in caffe is basically a Renaming layer:  needs special operation: add names to the hash
     */
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    if (caffeLayer.bottom_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input",caffeLayer.name(),caffeLayer.type());
    }
    
    std::string input = caffeLayer.bottom(0);
    for (const auto& output: caffeLayer.top()){
        mappingDataBlobNames[output] = input;
    }
}